

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_glib.cpp
# Opt level: O2

gboolean socketNotifierSourceCheck(GSource *source)

{
  uint uVar1;
  uint *puVar2;
  Type TVar3;
  uint uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  char *t [3];
  QMessageLogger local_78;
  char *local_58 [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0;
  uVar5 = 0;
  do {
    while( true ) {
      if ((uVar4 != 0) || (source[1].source_funcs <= (GSourceFuncs *)(ulong)uVar5)) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return uVar4;
        }
        __stack_chk_fail();
      }
      puVar2 = *(uint **)(source[1].callback_funcs + (long)(ulong)uVar5 * 8);
      if ((*(ushort *)((long)puVar2 + 6) & 0x20) == 0) break;
      local_58[0] = "Read";
      local_58[1] = "Write";
      local_58[2] = "Exception";
      local_78.context.version = 2;
      local_78.context.function._4_4_ = 0;
      local_78.context._4_8_ = 0;
      local_78.context._12_8_ = 0;
      local_78.context.category = "default";
      uVar1 = *puVar2;
      TVar3 = QSocketNotifier::type(*(QSocketNotifier **)(puVar2 + 2));
      QMessageLogger::warning
                (&local_78,"QSocketNotifier: Invalid socket %d and type \'%s\', disabling...",
                 (ulong)uVar1,local_58[(int)TVar3]);
      QSocketNotifier::setEnabled(*(QSocketNotifier **)(puVar2 + 2),false);
    }
    uVar4 = (uint)(((ushort)puVar2[1] & *(ushort *)((long)puVar2 + 6)) != 0);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static gboolean socketNotifierSourceCheck(GSource *source)
{
    GSocketNotifierSource *src = reinterpret_cast<GSocketNotifierSource *>(source);

    bool pending = false;
    for (int i = 0; !pending && i < src->pollfds.size(); ++i) {
        GPollFDWithQSocketNotifier *p = src->pollfds.at(i);

        if (p->pollfd.revents & G_IO_NVAL) {
            // disable the invalid socket notifier
            const char * const t[] = { "Read", "Write", "Exception" };
            qWarning("QSocketNotifier: Invalid socket %d and type '%s', disabling...",
                     p->pollfd.fd, t[int(p->socketNotifier->type())]);
            // ### note, modifies src->pollfds!
            p->socketNotifier->setEnabled(false);
            i--;
        } else {
            pending = pending || ((p->pollfd.revents & p->pollfd.events) != 0);
        }
    }

    return pending;
}